

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O2

void __thiscall toktxApp::validateOptions(toktxApp *this)

{
  string *psVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  
  scApp::validateOptions(&this->super_scApp);
  iVar4 = (this->options).automipmap;
  iVar2 = (this->options).genmipmap;
  if (iVar2 + iVar4 + (this->options).mipmap < 2) {
    if ((iVar2 == 0 && iVar4 == 0) || ((this->options).levels < 2)) {
      if ((this->options).cubemap == 0) {
        uVar3 = (this->options).depth;
        bVar9 = uVar3 == 0;
      }
      else {
        if ((this->options).lower_left_maps_to_s0t0 == 0) {
          bVar8 = false;
        }
        else {
          ktxApp::error((ktxApp *)this,
                        "cubemaps require images to have an upper-left origin. Ignoring --lower_left_maps_to_s0t0."
                       );
          (this->options).lower_left_maps_to_s0t0 = 0;
          bVar8 = (this->options).cubemap == 0;
        }
        uVar3 = (this->options).depth;
        bVar9 = uVar3 == 0;
        if (!bVar8 && !bVar9) {
          pcVar7 = "cubemaps cannot have 3D textures.";
          goto LAB_0011136b;
        }
      }
      if ((this->options).layers == 0 || bVar9) {
        iVar4 = (this->options).resize;
        if (iVar4 == 0 || (this->options).scale == 1.0) {
          if ((iVar4 == 0) || ((this->options).mipmap == 0)) {
            if ((uVar3 < 2) || ((this->options).genmipmap == 0)) {
              psVar1 = &(this->options).super_commandOptions.super_commandOptions.outfile;
              iVar4 = std::__cxx11::string::compare((char *)psVar1);
              if ((iVar4 != 0) &&
                 (lVar5 = std::__cxx11::string::rfind((char)psVar1,0x2e), lVar5 == -1)) {
                std::__cxx11::string::append((char *)psVar1);
              }
              uVar6 = 6;
              if ((this->options).cubemap == 0) {
                uVar6 = (ulong)(this->options).levels;
              }
              if (uVar6 <= (ulong)((long)(this->options).super_commandOptions.super_commandOptions.
                                         infiles.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->options).super_commandOptions.super_commandOptions.
                                         infiles.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                return;
              }
              pcVar7 = "too few input files.";
            }
            else {
              pcVar7 = 
              "generation of mipmaps for 3d textures is not supported.\nA PR to add this feature will be gratefully accepted!"
              ;
            }
            ktxApp::error((ktxApp *)this,pcVar7);
            goto LAB_0011137e;
          }
          pcVar7 = "only one of --resize and --mipmap can be specified.";
        }
        else {
          pcVar7 = "only one of --scale and --resize can be specified.";
        }
      }
      else {
        pcVar7 = "cannot have 3D array textures.";
      }
    }
    else {
      pcVar7 = "cannot specify --levels > 1 with --automipmap or --genmipmap.";
    }
  }
  else {
    pcVar7 = "only one of --automipmap, --genmipmap and --mipmap may be specified.";
  }
LAB_0011136b:
  ktxApp::error((ktxApp *)this,pcVar7);
  (*(this->super_scApp).super_ktxApp._vptr_ktxApp[1])(this);
LAB_0011137e:
  exit(1);
}

Assistant:

void
toktxApp::validateOptions()
{
    scApp::validateOptions();

    if (options.automipmap + options.genmipmap + options.mipmap > 1) {
        error("only one of --automipmap, --genmipmap and "
              "--mipmap may be specified.");
        usage();
        exit(1);
    }
    if ((options.automipmap || options.genmipmap) && options.levels > 1) {
        error("cannot specify --levels > 1 with --automipmap or --genmipmap.");
        usage();
        exit(1);
    }
    if (options.cubemap && options.lower_left_maps_to_s0t0) {
        error("cubemaps require images to have an upper-left origin. "
              "Ignoring --lower_left_maps_to_s0t0.");
        options.lower_left_maps_to_s0t0 = 0;
    }
    if (options.cubemap && options.depth > 0) {
        error("cubemaps cannot have 3D textures.");
        usage();
        exit(1);
    }
    if (options.layers && options.depth > 0) {
        error("cannot have 3D array textures.");
        usage();
        exit(1);
    }
    if (options.scale != 1.0 && options.resize) {
        error("only one of --scale and --resize can be specified.");
        usage();
        exit(1);
    }
    if (options.resize && options.mipmap) {
        error("only one of --resize and --mipmap can be specified.");
        usage();
        exit(1);
    }

    if (options.depth > 1 && options.genmipmap) {
        error("generation of mipmaps for 3d textures is not supported.\n"
              "A PR to add this feature will be gratefully accepted!");
        exit(1);
    }

    if (options.outfile.compare("-") != 0
            && options.outfile.find_last_of('.') == string::npos)
    {
        options.outfile.append(options.ktx2 ? ".ktx2" : ".ktx");
    }

    ktx_uint32_t requiredInputFiles = options.cubemap ? 6 : 1 * options.levels;
    if (requiredInputFiles > options.infiles.size()) {
        error("too few input files.");
        exit(1);
    }
    /* Whether there are enough input files for all the mipmap levels in
     * a full pyramid can only be checked when the first file has been
     * read and the size determined.
     */
}